

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t archive_read_format_cab_bid(archive_read *a,wchar_t best_bid)

{
  wchar_t wVar1;
  void *pvVar2;
  wchar_t next;
  char *h;
  ssize_t window;
  ssize_t offset;
  ssize_t bytes_avail;
  char *p;
  archive_read *paStack_18;
  wchar_t best_bid_local;
  archive_read *a_local;
  
  if (best_bid < L'A') {
    p._4_4_ = best_bid;
    paStack_18 = a;
    bytes_avail = (ssize_t)__archive_read_ahead(a,8,(ssize_t *)0x0);
    if ((long *)bytes_avail == (long *)0x0) {
      a_local._4_4_ = L'\xffffffff';
    }
    else if (*(long *)bytes_avail == 0x4643534d) {
      a_local._4_4_ = L'@';
    }
    else if (((char)*(long *)bytes_avail == 'M') && (*(char *)(bytes_avail + 1) == 'Z')) {
      window = 0;
      h = (char *)0x1000;
      do {
        while( true ) {
          if (0x1ffff < window) goto LAB_001c4580;
          pvVar2 = __archive_read_ahead(paStack_18,(size_t)(h + window),&offset);
          if (pvVar2 == (void *)0x0) break;
          for (bytes_avail = (long)pvVar2 + window;
              bytes_avail + 8U < (ulong)((long)pvVar2 + offset); bytes_avail = bytes_avail + wVar1)
          {
            wVar1 = find_cab_magic((char *)bytes_avail);
            if (wVar1 == L'\0') {
              return L'@';
            }
          }
          window = bytes_avail - (long)pvVar2;
        }
        h = (char *)((long)h >> 1);
      } while ((char *)0x7f < h);
      a_local._4_4_ = L'\0';
    }
    else {
LAB_001c4580:
      a_local._4_4_ = L'\0';
    }
  }
  else {
    a_local._4_4_ = L'\xffffffff';
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_cab_bid(struct archive_read *a, int best_bid)
{
	const char *p;
	ssize_t bytes_avail, offset, window;

	/* If there's already a better bid than we can ever
	   make, don't bother testing. */
	if (best_bid > 64)
		return (-1);

	if ((p = __archive_read_ahead(a, 8, NULL)) == NULL)
		return (-1);

	if (memcmp(p, "MSCF\0\0\0\0", 8) == 0)
		return (64);

	/*
	 * Attempt to handle self-extracting archives
	 * by noting a PE header and searching forward
	 * up to 128k for a 'MSCF' marker.
	 */
	if (p[0] == 'M' && p[1] == 'Z') {
		offset = 0;
		window = 4096;
		while (offset < (1024 * 128)) {
			const char *h = __archive_read_ahead(a, offset + window,
			    &bytes_avail);
			if (h == NULL) {
				/* Remaining bytes are less than window. */
				window >>= 1;
				if (window < 128)
					return (0);
				continue;
			}
			p = h + offset;
			while (p + 8 < h + bytes_avail) {
				int next;
				if ((next = find_cab_magic(p)) == 0)
					return (64);
				p += next;
			}
			offset = p - h;
		}
	}
	return (0);
}